

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int add_private_class_field(JSParseState *s,JSFunctionDef *fd,JSAtom name,JSVarKindEnum var_kind)

{
  undefined1 *puVar1;
  uint uVar2;
  
  uVar2 = add_scope_var(s->ctx,fd,name,var_kind);
  if (-1 < (int)uVar2) {
    puVar1 = &fd->vars[uVar2].field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 | 3;
  }
  return uVar2;
}

Assistant:

static int add_private_class_field(JSParseState *s, JSFunctionDef *fd,
                                   JSAtom name, JSVarKindEnum var_kind)
{
    JSContext *ctx = s->ctx;
    JSVarDef *vd;
    int idx;

    idx = add_scope_var(ctx, fd, name, var_kind);
    if (idx < 0)
        return idx;
    vd = &fd->vars[idx];
    vd->is_lexical = 1;
    vd->is_const = 1;
    return idx;
}